

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpectedFunctionsListTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_TestShell::
TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_TestShell
          (TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_TestShell *this)

{
  TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_TestShell_0032c260;
  return;
}

Assistant:

TEST(MockExpectedCallsList, callToStringForFulfilledFunctions)
{
    call1->withName("foo");
    call2->withName("bar");

    call2->callWasMade(1);
    call1->callWasMade(2);

    list->addExpectedCall(call1);
    list->addExpectedCall(call2);

    SimpleString expectedString;
    expectedString = StringFromFormat("%s\n%s", call1->callToString().asCharString(), call2->callToString().asCharString());
    STRCMP_EQUAL(expectedString.asCharString(), list->fulfilledCallsToString().asCharString());
}